

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  short sVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int cx;
  int cy;
  ushort uVar7;
  undefined8 ptr;
  int iVar8;
  int iVar9;
  uint uVar10;
  int num_vertices;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  stbtt_vertex *vertices;
  ushort *puVar14;
  size_t sVar15;
  stbtt_vertex *psVar16;
  ulong uVar17;
  short sVar18;
  int was_off;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int sx;
  int sy;
  long lVar22;
  long lVar23;
  byte bVar24;
  short sVar25;
  ushort uVar26;
  byte bVar27;
  stbtt_int32 cx_00;
  stbtt_int32 sVar28;
  stbtt_int32 cy_00;
  stbtt_int32 sVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  float fVar37;
  ushort *local_108;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  stbtt__csctx local_a8;
  stbtt__csctx count_ctx;
  
  if ((info->cff).size == 0) {
    puVar3 = info->data;
    uVar10 = stbtt__GetGlyfOffset(info,glyph_index);
    *pvertices = (stbtt_vertex *)0x0;
    uVar12 = 0;
    if (-1 < (int)uVar10) {
      uVar13 = (ulong)uVar10;
      uVar7 = CONCAT11(puVar3[uVar13],puVar3[uVar13 + 1]);
      if ((short)uVar7 < 1) {
        if (uVar7 == 0xffff) {
          vertices = (stbtt_vertex *)0x0;
          uVar12 = 0;
          puVar14 = (ushort *)(puVar3 + uVar13 + 10);
          do {
            count_ctx.bounds = 0;
            count_ctx.started = 0;
            bVar24 = *(byte *)((long)puVar14 + 1);
            if ((bVar24 & 2) == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imstb_truetype.h"
                            ,0x70b,
                            "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)"
                           );
            }
            if ((bVar24 & 1) == 0) {
              iVar8 = (int)(char)puVar14[2];
              iVar9 = (int)((long)((ulong)*(byte *)((long)puVar14 + 5) << 0x38) >> 0x38);
              lVar22 = 6;
            }
            else {
              auVar5._9_7_ = 0;
              auVar5._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
              auVar4._10_6_ = 0;
              auVar4._0_10_ = SUB1610(auVar5 << 0x38,6);
              auVar34._11_5_ = 0;
              auVar34._0_11_ = SUB1611(auVar4 << 0x30,5);
              auVar6._1_12_ = SUB1612(auVar34 << 0x28,4);
              auVar6[0] = (char)puVar14[3];
              auVar6._13_3_ = 0;
              auVar31._1_14_ = SUB1614(auVar6 << 0x18,2);
              auVar31[0] = (char)puVar14[2];
              auVar31[0xf] = 0;
              auVar31 = ZEXT416((uint)*(byte *)((long)puVar14 + 7) << 0x10 |
                                (uint)*(byte *)((long)puVar14 + 5)) | auVar31 << 8;
              iVar8 = (int)auVar31._0_2_;
              iVar9 = (int)auVar31._2_2_;
              lVar22 = 8;
            }
            local_108 = (ushort *)(lVar22 + (long)puVar14);
            if ((bVar24 & 8) == 0) {
              if ((bVar24 & 0x40) != 0) {
                uVar7 = *local_108;
                fVar35 = (float)(int)(short)(local_108[1] << 8 | local_108[1] >> 8) * 6.1035156e-05;
                local_108 = local_108 + 2;
                _local_c8 = ZEXT416((uint)((float)(int)(short)(uVar7 << 8 | uVar7 >> 8) *
                                          6.1035156e-05));
                goto LAB_001aab67;
              }
              if ((char)bVar24 < '\0') {
                local_c8._0_4_ =
                     (float)(int)CONCAT11((char)*local_108,*(undefined1 *)((long)local_108 + 1)) *
                     6.1035156e-05;
                local_c8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)local_108[2],
                                                         *(undefined1 *)((long)local_108 + 5)) <<
                                        0x30) >> 0x30) * 6.1035156e-05;
                register0x00001288 = 0;
                local_e8._0_4_ =
                     (float)(int)CONCAT11((char)local_108[1],*(undefined1 *)((long)local_108 + 3)) *
                     6.1035156e-05;
                local_e8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)local_108[3],
                                                         *(undefined1 *)((long)local_108 + 7)) <<
                                        0x30) >> 0x30) * 6.1035156e-05;
                register0x00001248 = 0;
                local_108 = local_108 + 4;
              }
              else {
                _local_c8 = ZEXT812(0x3f800000);
                fStack_bc = 0.0;
                _local_e8 = ZEXT816(0x3f80000000000000);
              }
            }
            else {
              fVar35 = (float)(int)(short)(*local_108 << 8 | *local_108 >> 8) * 6.1035156e-05;
              local_108 = local_108 + 1;
              register0x00001244 = SUB1612((undefined1  [16])0x0,4);
              local_c8._0_4_ = fVar35;
LAB_001aab67:
              _local_e8 = ZEXT416((uint)fVar35) << 0x20;
            }
            uVar10 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar14[1] << 8 | puVar14[1] >> 8),
                                         (stbtt_vertex **)&count_ctx);
            ptr = count_ctx._0_8_;
            if (0 < (int)uVar10) {
              auVar30._0_4_ = (float)local_e8._0_4_ * (float)local_e8._0_4_;
              auVar30._4_4_ = (float)local_e8._4_4_ * (float)local_e8._4_4_;
              auVar30._8_4_ = fStack_e0 * fStack_e0;
              auVar30._12_4_ = fStack_dc * fStack_dc;
              auVar32._0_4_ = (float)local_c8._0_4_ * (float)local_c8._0_4_ + auVar30._0_4_;
              auVar32._4_4_ = (float)local_c8._4_4_ * (float)local_c8._4_4_ + auVar30._4_4_;
              auVar32._8_4_ = fStack_c0 * fStack_c0 + auVar30._8_4_;
              auVar32._12_4_ = fStack_bc * fStack_bc + auVar30._12_4_;
              auVar31 = sqrtps(auVar30,auVar32);
              sVar15 = 0;
              do {
                fVar35 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + sVar15) <<
                                            0x30) >> 0x30);
                fVar36 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + sVar15);
                fVar37 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + sVar15) <<
                                            0x30) >> 0x30);
                auVar33._0_4_ =
                     (int)((fVar36 * (float)local_c8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + sVar15) * (float)local_c8._0_4_
                           + (float)iVar8) * auVar31._0_4_);
                auVar33._4_4_ =
                     (int)((fVar36 * (float)local_e8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + sVar15) * (float)local_e8._0_4_
                           + (float)iVar9) * auVar31._4_4_);
                auVar33._8_4_ =
                     (int)((fVar37 * (float)local_c8._4_4_ + fVar35 * (float)local_c8._0_4_ +
                           (float)iVar8) * auVar31._0_4_);
                auVar33._12_4_ =
                     (int)((fVar37 * (float)local_e8._4_4_ + fVar35 * (float)local_e8._0_4_ +
                           (float)iVar9) * auVar31._4_4_);
                auVar34 = packssdw(auVar33,auVar33);
                *(long *)(count_ctx._0_8_ + sVar15) = auVar34._0_8_;
                sVar15 = sVar15 + 0xe;
              } while ((ulong)uVar10 * 0xe != sVar15);
              psVar16 = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar10 + uVar12) * 0xe);
              if (psVar16 == (stbtt_vertex *)0x0) {
                if (vertices != (stbtt_vertex *)0x0) {
                  ImGui::MemFree(vertices);
                }
                ImGui::MemFree((void *)ptr);
                return 0;
              }
              if (0 < (int)uVar12) {
                memcpy(psVar16,vertices,(ulong)uVar12 * 0xe);
              }
              memcpy(psVar16 + uVar12,(void *)ptr,(ulong)uVar10 * 0xe);
              if (vertices != (stbtt_vertex *)0x0) {
                ImGui::MemFree(vertices);
              }
              ImGui::MemFree((void *)ptr);
              vertices = psVar16;
              uVar12 = uVar10 + uVar12;
            }
            puVar14 = local_108;
          } while ((bVar24 & 0x20) != 0);
        }
        else {
          if ((short)((ushort)puVar3[uVar13] << 8) < 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imstb_truetype.h"
                          ,0x740,
                          "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)"
                         );
          }
          uVar12 = 0;
          vertices = (stbtt_vertex *)0x0;
        }
      }
      else {
        uVar12 = (uint)uVar7 * 2;
        uVar17 = (ulong)uVar12;
        bVar24 = puVar3[uVar17 + uVar13 + 10];
        bVar27 = puVar3[uVar17 + uVar13 + 0xb];
        bVar1 = puVar3[uVar17 + uVar13 + 9];
        iVar8 = (uint)puVar3[uVar17 + uVar13 + 8] * 0x100;
        vertices = (stbtt_vertex *)
                   ImGui::MemAlloc((ulong)(((uint)bVar1 + iVar8 + (uint)uVar7 * 2) * 0xe + 0xe));
        if (vertices == (stbtt_vertex *)0x0) {
          return 0;
        }
        puVar14 = (ushort *)(puVar3 + (ulong)bVar24 * 0x100 + (ulong)bVar27 + uVar17 + uVar13 + 0xc)
        ;
        uVar17 = uVar17 & 0xffff;
        iVar9 = (int)uVar17;
        uVar21 = (ulong)(iVar8 + (uint)bVar1);
        lVar22 = 0;
        bVar24 = 0;
        bVar27 = 0;
        do {
          if (bVar27 == 0) {
            bVar24 = (byte)*puVar14;
            if ((bVar24 & 8) == 0) {
              puVar14 = (ushort *)((long)puVar14 + 1);
              bVar27 = 0;
            }
            else {
              bVar27 = *(byte *)((long)puVar14 + 1);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            bVar27 = bVar27 - 1;
          }
          *(byte *)((long)vertices + lVar22 + (ulong)(uint)(iVar9 << 4) + uVar17 * -2 + 0xc) =
               bVar24;
          lVar22 = lVar22 + 0xe;
        } while ((ulong)(((uint)bVar1 + iVar8 + 1) * 0x10) - (uVar21 * 2 + 2) != lVar22);
        lVar22 = (ulong)(uint)(iVar9 << 4) + uVar17 * -2;
        lVar23 = 0;
        sVar25 = 0;
        do {
          bVar24 = *(byte *)((long)vertices + lVar23 + lVar22 + 0xc);
          if ((bVar24 & 2) == 0) {
            if ((bVar24 & 0x10) == 0) {
              sVar25 = sVar25 + (*puVar14 << 8 | *puVar14 >> 8);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar26 = *puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1);
            uVar7 = -(ushort)(byte)uVar26;
            if ((bVar24 & 0x10) != 0) {
              uVar7 = (ushort)(byte)uVar26;
            }
            sVar25 = sVar25 + uVar7;
          }
          *(short *)((long)vertices + lVar23 + lVar22) = sVar25;
          lVar23 = lVar23 + 0xe;
        } while ((ulong)((iVar8 + (uint)bVar1 + 1) * 0x10) - (uVar21 * 2 + 2) != lVar23);
        lVar22 = (ulong)(uint)(iVar9 << 4) + uVar17 * -2;
        lVar23 = 0;
        sVar25 = 0;
        do {
          bVar24 = *(byte *)((long)vertices + lVar23 + lVar22 + 0xc);
          if ((bVar24 & 4) == 0) {
            if ((bVar24 & 0x20) == 0) {
              sVar25 = sVar25 + (*puVar14 << 8 | *puVar14 >> 8);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar7 = *puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1);
            uVar26 = -(ushort)(byte)uVar7;
            if ((bVar24 & 0x20) != 0) {
              uVar26 = (ushort)(byte)uVar7;
            }
            sVar25 = sVar25 + uVar26;
          }
          *(short *)((long)vertices + lVar23 + lVar22 + 2) = sVar25;
          lVar23 = lVar23 + 0xe;
        } while ((ulong)((iVar8 + (uint)bVar1 + 1) * 0x10) - (uVar21 * 2 + 2) != lVar23);
        num_vertices = 0;
        iVar9 = 0;
        iVar19 = 0;
        iVar11 = 0;
        sVar29 = 0;
        sVar28 = 0;
        sy = 0;
        sx = 0;
        uVar10 = 0;
        was_off = 0;
        cx = 0;
        cy = 0;
        do {
          lVar22 = (long)(int)(uVar12 + iVar9);
          bVar24 = vertices[lVar22].type;
          sVar25 = vertices[lVar22].x;
          sVar2 = vertices[lVar22].y;
          cx_00 = (stbtt_int32)sVar25;
          cy_00 = (stbtt_int32)sVar2;
          if (iVar11 == iVar9) {
            if (iVar9 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,was_off,uVar10,sx,sy,sVar28,
                                                sVar29,cx,cy);
            }
            sx = cx_00;
            sy = cy_00;
            if ((bVar24 & 1) == 0) {
              sVar28 = cx_00;
              sVar29 = cy_00;
              if ((vertices[lVar22 + 1].type & 1) == 0) {
                sx = vertices[lVar22 + 1].x + cx_00 >> 1;
                sy = vertices[lVar22 + 1].y + cy_00 >> 1;
              }
              else {
                iVar9 = iVar9 + 1;
                sx = (int)vertices[lVar22 + 1].x;
                sy = (int)vertices[lVar22 + 1].y;
              }
            }
            uVar10 = bVar24 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)sy;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar11 = (ushort)(*(ushort *)(puVar3 + (long)iVar19 * 2 + uVar13 + 10) << 8 |
                             *(ushort *)(puVar3 + (long)iVar19 * 2 + uVar13 + 10) >> 8) + 1;
            iVar19 = iVar19 + 1;
            was_off = 0;
            iVar20 = iVar9;
            num_vertices = num_vertices + 1;
            cx_00 = cx;
            cy_00 = cy;
          }
          else {
            sVar18 = (short)cy;
            iVar20 = iVar9;
            if ((bVar24 & 1) == 0) {
              iVar9 = num_vertices;
              if (was_off != 0) {
                iVar9 = num_vertices + 1;
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(cx + cx_00) >> 1);
                vertices[num_vertices].y = (short)((uint)(cy + cy_00) >> 1);
                vertices[num_vertices].cx = (short)cx;
                vertices[num_vertices].cy = sVar18;
              }
              was_off = 1;
              num_vertices = iVar9;
            }
            else {
              psVar16 = vertices + num_vertices;
              if (was_off == 0) {
                psVar16->type = '\x02';
                psVar16->x = sVar25;
                psVar16->y = sVar2;
                psVar16->cx = 0;
                sVar18 = 0;
              }
              else {
                psVar16->type = '\x03';
                psVar16->x = sVar25;
                psVar16->y = sVar2;
                psVar16->cx = (short)cx;
              }
              psVar16->cy = sVar18;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx_00 = cx;
              cy_00 = cy;
            }
          }
          iVar9 = iVar20 + 1;
          cx = cx_00;
          cy = cy_00;
        } while (iVar20 < (int)((uint)bVar1 + iVar8));
        uVar12 = stbtt__close_shape(vertices,num_vertices,was_off,uVar10,sx,sy,sVar28,sVar29,cx_00,
                                    cy_00);
      }
      *pvertices = vertices;
    }
  }
  else {
    count_ctx.first_x = 0.0;
    count_ctx.first_y = 0.0;
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    uVar12 = 0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx.bounds = 1;
    count_ctx.started = 0;
    local_a8.num_vertices = 0;
    local_a8._52_4_ = 0;
    local_a8.min_y = 0;
    local_a8.max_y = 0;
    local_a8.pvertices = (stbtt_vertex *)0x0;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    local_a8.min_x = 0;
    local_a8.max_x = 0;
    local_a8.bounds = 0;
    local_a8.started = 0;
    local_a8.first_x = 0.0;
    local_a8.first_y = 0.0;
    iVar8 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar8 != 0) {
      iVar8 = count_ctx.num_vertices;
      local_a8.pvertices = (stbtt_vertex *)ImGui::MemAlloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = local_a8.pvertices;
      iVar9 = stbtt__run_charstring(info,glyph_index,&local_a8);
      if (iVar9 != 0) {
        if (local_a8.num_vertices == iVar8) {
          return iVar8;
        }
        __assert_fail("output_ctx.num_vertices == count_ctx.num_vertices",
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imstb_truetype.h"
                      ,0x8c6,
                      "int stbtt__GetGlyphShapeT2(const stbtt_fontinfo *, int, stbtt_vertex **)");
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
  }
  return uVar12;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}